

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_compress_forceExtDict(LZ4_stream_t *LZ4_dict,char *source,char *dest,int srcSize)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  ulong *puVar7;
  ulong uVar8;
  int *piVar9;
  ulong *puVar10;
  char *pcVar11;
  uint uVar12;
  int iVar13;
  int *piVar14;
  long lVar15;
  char *pcVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  ulong *puVar20;
  ulong *puVar21;
  char cVar22;
  ulong uVar23;
  ulong uVar24;
  BYTE *d;
  ulong uVar25;
  long lVar26;
  ulong *puVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  BYTE *e;
  ulong *puVar31;
  U32 *hashTable;
  ulong *puVar32;
  ulong *puVar33;
  char *local_a8;
  
  LZ4_renormDictT(&LZ4_dict->internal_donotuse,srcSize);
  uVar19 = (LZ4_dict->internal_donotuse).dictSize;
  uVar25 = (ulong)uVar19;
  uVar1 = (LZ4_dict->internal_donotuse).currentOffset;
  lVar30 = (long)source - (ulong)uVar1;
  lVar6 = -(ulong)uVar1;
  piVar2 = (int *)(LZ4_dict->internal_donotuse).dictionary;
  iVar29 = (int)lVar30;
  iVar5 = (int)dest;
  puVar33 = (ulong *)source;
  local_a8 = dest;
  if (uVar19 < uVar1 && uVar19 < 0x10000) {
    if ((uint)srcSize < 0x7e000001) {
      (LZ4_dict->internal_donotuse).dictSize = uVar19 + srcSize;
      (LZ4_dict->internal_donotuse).currentOffset = uVar1 + srcSize;
      (LZ4_dict->internal_donotuse).tableType = 2;
      if (0xc < (uint)srcSize) {
        puVar7 = (ulong *)(source + (long)srcSize + -5);
        lVar6 = (long)piVar2 + lVar6 + uVar25;
        *(uint *)((long)LZ4_dict + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar1;
        puVar10 = (ulong *)(source + (long)srcSize + -0xc);
LAB_00110f58:
        uVar23 = 1;
        uVar8 = 0x40;
        uVar24 = *(ulong *)((long)puVar33 + 1);
        puVar27 = (ulong *)((long)puVar33 + 1);
        do {
          puVar32 = (ulong *)(uVar23 + (long)puVar27);
          dest = local_a8;
          if (source + (long)srcSize + -0xb < puVar32) break;
          uVar23 = uVar24 * -0x30e4432345000000 >> 0x34;
          iVar28 = (int)puVar27;
          uVar12 = iVar28 - iVar29;
          uVar18 = *(uint *)((long)LZ4_dict + uVar23 * 4);
          uVar24 = *puVar32;
          *(uint *)((long)LZ4_dict + uVar23 * 4) = uVar12;
          if ((uVar1 - uVar19 <= uVar18) && (uVar12 <= uVar18 + 0xffff)) {
            lVar26 = lVar6;
            if (uVar1 <= uVar18) {
              lVar26 = lVar30;
            }
            if (*(int *)(lVar26 + (ulong)uVar18) == (int)*puVar27) goto LAB_00110fcb;
          }
          uVar23 = uVar8 >> 6;
          uVar8 = (ulong)((int)uVar8 + 1);
          puVar27 = puVar32;
        } while( true );
      }
LAB_00111a16:
      pcVar16 = source + ((long)srcSize - (long)puVar33);
      if (pcVar16 < (char *)0xf) {
LAB_00111a77:
        *dest = (char)pcVar16 << 4;
      }
      else {
        *dest = -0x10;
        for (pcVar11 = pcVar16 + -0xf; dest = dest + 1, (char *)0xfe < pcVar11;
            pcVar11 = pcVar11 + -0xff) {
          *dest = -1;
        }
LAB_00111a80:
        *dest = (char)pcVar11;
      }
      memcpy(dest + 1,puVar33,(size_t)pcVar16);
      iVar5 = ((int)(dest + 1) + (int)pcVar16) - iVar5;
      goto LAB_00111a98;
    }
  }
  else if ((uint)srcSize < 0x7e000001) {
    (LZ4_dict->internal_donotuse).dictSize = uVar19 + srcSize;
    (LZ4_dict->internal_donotuse).currentOffset = uVar1 + srcSize;
    (LZ4_dict->internal_donotuse).tableType = 2;
    if (0xc < (uint)srcSize) {
      puVar10 = (ulong *)(source + (long)srcSize + -5);
      lVar6 = (long)piVar2 + lVar6 + uVar25;
      *(uint *)((long)LZ4_dict + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
           uVar1;
      puVar7 = (ulong *)(source + (long)srcSize + -0xc);
LAB_0011151a:
      uVar23 = 1;
      uVar24 = *(ulong *)((long)puVar33 + 1);
      uVar8 = 0x40;
      puVar27 = (ulong *)((long)puVar33 + 1);
      do {
        puVar32 = (ulong *)(uVar23 + (long)puVar27);
        dest = local_a8;
        if (source + (long)srcSize + -0xb < puVar32) break;
        uVar23 = uVar24 * -0x30e4432345000000 >> 0x34;
        iVar28 = (int)puVar27;
        uVar18 = iVar28 - iVar29;
        uVar19 = *(uint *)((long)LZ4_dict + uVar23 * 4);
        uVar24 = *puVar32;
        *(uint *)((long)LZ4_dict + uVar23 * 4) = uVar18;
        if (uVar18 <= uVar19 + 0xffff) {
          lVar26 = lVar6;
          if (uVar1 <= uVar19) {
            lVar26 = lVar30;
          }
          if (*(int *)(lVar26 + (ulong)uVar19) == (int)*puVar27) goto LAB_0011158e;
        }
        uVar23 = uVar8 >> 6;
        uVar8 = (ulong)((int)uVar8 + 1);
        puVar27 = puVar32;
      } while( true );
    }
LAB_00111a51:
    pcVar16 = source + ((long)srcSize - (long)puVar33);
    if (pcVar16 < (char *)0xf) goto LAB_00111a77;
    *dest = -0x10;
    for (pcVar11 = pcVar16 + -0xf; dest = dest + 1, (char *)0xfe < pcVar11;
        pcVar11 = pcVar11 + -0xff) {
      *dest = -1;
    }
    goto LAB_00111a80;
  }
  iVar5 = 0;
LAB_00111a98:
  (LZ4_dict->internal_donotuse).dictionary = (uint8_t *)source;
  (LZ4_dict->internal_donotuse).dictSize = srcSize;
  return iVar5;
LAB_0011158e:
  lVar26 = lVar26 + (ulong)uVar19;
  piVar14 = (int *)source;
  if (uVar19 < uVar1) {
    piVar14 = piVar2;
  }
  iVar13 = uVar18 - uVar19;
  iVar17 = (int)puVar33;
  lVar3 = 0;
  cVar4 = (char)puVar27 * '\x10' + (char)puVar33 * -0x10;
  do {
    cVar22 = cVar4;
    lVar15 = lVar3;
    piVar9 = (int *)(lVar26 + lVar15);
    puVar32 = (ulong *)((long)puVar27 + lVar15);
    if ((piVar9 <= piVar14) || (puVar32 <= puVar33)) break;
    lVar3 = lVar15 + -1;
    cVar4 = cVar22 + -0x10;
  } while (*(char *)((long)puVar27 + lVar15 + -1) == *(char *)(lVar26 + -1 + lVar15));
  if ((uint)((iVar28 - iVar17) + (int)lVar15) < 0xf) {
    puVar27 = (ulong *)(local_a8 + 1);
    *local_a8 = cVar22;
  }
  else {
    *local_a8 = -0x10;
    puVar27 = (ulong *)(local_a8 + 2);
    for (iVar28 = (iVar28 - iVar17) + (int)lVar15 + -0xf; 0xfe < iVar28; iVar28 = iVar28 + -0xff) {
      *(char *)((long)puVar27 + -1) = -1;
      puVar27 = (ulong *)((long)puVar27 + 1);
    }
    *(char *)((long)puVar27 + -1) = (char)iVar28;
  }
  puVar31 = (ulong *)((ulong)(uint)((int)puVar32 - iVar17) + (long)puVar27);
  do {
    *puVar27 = *puVar33;
    puVar27 = puVar27 + 1;
    puVar33 = puVar33 + 1;
  } while (puVar27 < puVar31);
  do {
    *(short *)puVar31 = (short)iVar13;
    if (piVar14 == piVar2) {
      puVar27 = (ulong *)((long)piVar2 + (uVar25 - (long)piVar9) + (long)puVar32);
      if (puVar10 < puVar27) {
        puVar27 = puVar10;
      }
      puVar33 = (ulong *)((long)puVar32 + 4);
      puVar20 = (ulong *)(piVar9 + 1);
      puVar21 = puVar33;
      if ((ulong *)((long)puVar27 - 7U) <= puVar33) {
LAB_001116f1:
        iVar28 = ((int)puVar21 - (int)puVar32) + -4;
LAB_001116fb:
        if (puVar21 < (ulong *)((long)puVar27 - 7U)) {
          if (*puVar20 == *puVar21) break;
          uVar23 = *puVar21 ^ *puVar20;
          uVar24 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
            }
          }
          uVar24 = (ulong)(((uint)(uVar24 >> 3) & 0x1fffffff) + iVar28);
        }
        else {
          if ((puVar21 < (ulong *)((long)puVar27 - 3U)) && ((int)*puVar20 == (int)*puVar21)) {
            puVar21 = (ulong *)((long)puVar21 + 4);
            puVar20 = (ulong *)((long)puVar20 + 4);
          }
          if ((puVar21 < (ulong *)((long)puVar27 - 1U)) && ((short)*puVar20 == (short)*puVar21)) {
            puVar21 = (ulong *)((long)puVar21 + 2);
            puVar20 = (ulong *)((long)puVar20 + 2);
          }
          if (puVar21 < puVar27) {
            puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar20 == (char)*puVar21));
          }
          uVar24 = (ulong)(uint)((int)puVar21 - (int)puVar33);
        }
        goto LAB_00111761;
      }
      if (*puVar20 == *puVar33) {
        puVar20 = (ulong *)(piVar9 + 3);
        puVar21 = (ulong *)((long)puVar32 + 0xc);
        goto LAB_001116f1;
      }
      uVar23 = *puVar33 ^ *puVar20;
      uVar24 = 0;
      if (uVar23 != 0) {
        for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
        }
      }
      uVar24 = uVar24 >> 3 & 0x1fffffff;
LAB_00111761:
      uVar19 = (uint)uVar24;
      puVar33 = (ulong *)((long)puVar32 + uVar24 + 4);
      if (puVar33 == puVar27) {
        puVar33 = puVar27;
        puVar20 = (ulong *)source;
        if (puVar7 <= puVar27) {
LAB_00111794:
          puVar32 = (ulong *)((long)puVar32 + (long)piVar2 + (uVar25 - (long)piVar9));
          if (puVar10 <= puVar32) {
            puVar32 = puVar10;
          }
          iVar28 = (int)puVar33 - (int)puVar32;
LAB_001117ad:
          if (puVar33 < puVar7) {
            if (*puVar20 == *puVar33) goto code_r0x001117c2;
            uVar23 = *puVar33 ^ *puVar20;
            uVar24 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
              }
            }
            uVar18 = ((uint)(uVar24 >> 3) & 0x1fffffff) + iVar28;
          }
          else {
            if ((puVar33 < source + (long)srcSize + -8) && ((int)*puVar20 == (int)*puVar33)) {
              puVar33 = (ulong *)((long)puVar33 + 4);
              puVar20 = (ulong *)((long)puVar20 + 4);
            }
            if ((puVar33 < source + (long)srcSize + -6) && ((short)*puVar20 == (short)*puVar33)) {
              puVar33 = (ulong *)((long)puVar33 + 2);
              puVar20 = (ulong *)((long)puVar20 + 2);
            }
            if (puVar33 < puVar10) {
              puVar33 = (ulong *)((long)puVar33 + (ulong)((char)*puVar20 == (char)*puVar33));
            }
            uVar18 = (int)puVar33 - (int)puVar27;
          }
          goto LAB_001117e7;
        }
        if (*(ulong *)source == *puVar27) {
          puVar33 = puVar27 + 1;
          puVar20 = (ulong *)(source + 8);
          goto LAB_00111794;
        }
        uVar23 = *puVar27 ^ *(ulong *)source;
        uVar24 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
          }
        }
        uVar18 = (uint)(uVar24 >> 3) & 0x1fffffff;
LAB_001117e7:
        uVar19 = uVar19 + uVar18;
        puVar33 = (ulong *)((long)puVar27 + (ulong)uVar18);
      }
    }
    else {
      puVar33 = (ulong *)((long)puVar32 + 4);
      puVar27 = (ulong *)(piVar9 + 1);
      puVar20 = puVar33;
      if (puVar7 <= puVar33) {
LAB_00111684:
        iVar28 = ((int)puVar20 - (int)puVar32) + -4;
LAB_0011168c:
        if (puVar20 < puVar7) {
          if (*puVar27 == *puVar20) goto code_r0x001116a4;
          uVar23 = *puVar20 ^ *puVar27;
          uVar24 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
            }
          }
          uVar24 = (ulong)(((uint)(uVar24 >> 3) & 0x1fffffff) + iVar28);
        }
        else {
          if ((puVar20 < source + (long)srcSize + -8) && ((int)*puVar27 == (int)*puVar20)) {
            puVar20 = (ulong *)((long)puVar20 + 4);
            puVar27 = (ulong *)((long)puVar27 + 4);
          }
          if ((puVar20 < source + (long)srcSize + -6) && ((short)*puVar27 == (short)*puVar20)) {
            puVar20 = (ulong *)((long)puVar20 + 2);
            puVar27 = (ulong *)((long)puVar27 + 2);
          }
          if (puVar20 < puVar10) {
            puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar27 == (char)*puVar20));
          }
          uVar24 = (ulong)(uint)((int)puVar20 - (int)puVar33);
        }
        goto LAB_0011173a;
      }
      if (*puVar27 == *puVar33) {
        puVar27 = (ulong *)(piVar9 + 3);
        puVar20 = (ulong *)((long)puVar32 + 0xc);
        goto LAB_00111684;
      }
      uVar23 = *puVar33 ^ *puVar27;
      uVar24 = 0;
      if (uVar23 != 0) {
        for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
        }
      }
      uVar24 = uVar24 >> 3 & 0x1fffffff;
LAB_0011173a:
      uVar19 = (uint)uVar24;
      puVar33 = (ulong *)((long)puVar32 + uVar24 + 4);
    }
    dest = (char *)((long)puVar31 + 2);
    if (uVar19 < 0xf) {
      *local_a8 = *local_a8 + (char)uVar19;
    }
    else {
      *local_a8 = *local_a8 + '\x0f';
      dest[0] = -1;
      dest[1] = -1;
      dest[2] = -1;
      dest[3] = -1;
      lVar26 = 0;
      for (uVar18 = uVar19 - 0xf; 0x3fb < uVar18; uVar18 = uVar18 - 0x3fc) {
        pcVar16 = (char *)((long)puVar31 + lVar26 + 6);
        pcVar16[0] = -1;
        pcVar16[1] = -1;
        pcVar16[2] = -1;
        pcVar16[3] = -1;
        lVar26 = lVar26 + 4;
      }
      lVar3 = lVar26 + (ulong)(uVar18 & 0xffff) / 0xff;
      dest = (char *)((long)puVar31 + lVar3 + 3);
      *(char *)((long)puVar31 + lVar3 + 2) =
           (char)((ushort)uVar18 / 0xff) + (char)uVar19 + -0xf + (char)lVar26;
    }
    if (source + (long)srcSize + -0xb <= puVar33) goto LAB_00111a51;
    *(int *)((long)LZ4_dict +
            ((ulong)(*(long *)((long)puVar33 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
         ((int)puVar33 + -2) - iVar29;
    uVar24 = *puVar33 * -0x30e4432345000000 >> 0x34;
    uVar18 = (int)puVar33 - iVar29;
    uVar19 = *(uint *)((long)LZ4_dict + uVar24 * 4);
    piVar14 = (int *)source;
    lVar26 = lVar30;
    if (uVar19 < uVar1) {
      piVar14 = piVar2;
      lVar26 = lVar6;
    }
    piVar9 = (int *)(lVar26 + (ulong)uVar19);
    *(uint *)((long)LZ4_dict + uVar24 * 4) = uVar18;
    local_a8 = dest;
    if ((uVar19 + 0xffff < uVar18) || (*piVar9 != (int)*puVar33)) goto LAB_0011151a;
    puVar31 = (ulong *)(dest + 1);
    *dest = '\0';
    iVar13 = uVar18 - uVar19;
    puVar32 = puVar33;
  } while( true );
  puVar21 = puVar21 + 1;
  puVar20 = puVar20 + 1;
  iVar28 = iVar28 + 8;
  goto LAB_001116fb;
code_r0x001117c2:
  puVar33 = puVar33 + 1;
  puVar20 = puVar20 + 1;
  iVar28 = iVar28 + 8;
  goto LAB_001117ad;
code_r0x001116a4:
  puVar20 = puVar20 + 1;
  puVar27 = puVar27 + 1;
  iVar28 = iVar28 + 8;
  goto LAB_0011168c;
LAB_00110fcb:
  lVar26 = lVar26 + (ulong)uVar18;
  piVar14 = (int *)source;
  if (uVar18 < uVar1) {
    piVar14 = piVar2;
  }
  iVar13 = uVar12 - uVar18;
  iVar17 = (int)puVar33;
  lVar3 = 0;
  cVar4 = (char)puVar27 * '\x10' + (char)puVar33 * -0x10;
  do {
    cVar22 = cVar4;
    lVar15 = lVar3;
    piVar9 = (int *)(lVar26 + lVar15);
    puVar32 = (ulong *)((long)puVar27 + lVar15);
    if ((piVar9 <= piVar14) || (puVar32 <= puVar33)) break;
    lVar3 = lVar15 + -1;
    cVar4 = cVar22 + -0x10;
  } while (*(char *)((long)puVar27 + lVar15 + -1) == *(char *)(lVar26 + -1 + lVar15));
  if ((uint)((iVar28 - iVar17) + (int)lVar15) < 0xf) {
    puVar27 = (ulong *)(local_a8 + 1);
    *local_a8 = cVar22;
  }
  else {
    *local_a8 = -0x10;
    puVar27 = (ulong *)(local_a8 + 2);
    for (iVar28 = (iVar28 - iVar17) + (int)lVar15 + -0xf; 0xfe < iVar28; iVar28 = iVar28 + -0xff) {
      *(char *)((long)puVar27 + -1) = -1;
      puVar27 = (ulong *)((long)puVar27 + 1);
    }
    *(char *)((long)puVar27 + -1) = (char)iVar28;
  }
  puVar31 = (ulong *)((ulong)(uint)((int)puVar32 - iVar17) + (long)puVar27);
  do {
    *puVar27 = *puVar33;
    puVar27 = puVar27 + 1;
    puVar33 = puVar33 + 1;
  } while (puVar27 < puVar31);
  do {
    *(short *)puVar31 = (short)iVar13;
    if (piVar14 == piVar2) {
      puVar27 = (ulong *)((long)piVar2 + (uVar25 - (long)piVar9) + (long)puVar32);
      if (puVar7 < puVar27) {
        puVar27 = puVar7;
      }
      puVar33 = (ulong *)((long)puVar32 + 4);
      puVar20 = (ulong *)(piVar9 + 1);
      puVar21 = puVar33;
      if ((ulong *)((long)puVar27 - 7U) <= puVar33) {
LAB_00111130:
        iVar28 = ((int)puVar21 - (int)puVar32) + -4;
LAB_0011113a:
        if (puVar21 < (ulong *)((long)puVar27 - 7U)) {
          if (*puVar20 == *puVar21) break;
          uVar23 = *puVar21 ^ *puVar20;
          uVar24 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
            }
          }
          uVar24 = (ulong)(((uint)(uVar24 >> 3) & 0x1fffffff) + iVar28);
        }
        else {
          if ((puVar21 < (ulong *)((long)puVar27 - 3U)) && ((int)*puVar20 == (int)*puVar21)) {
            puVar21 = (ulong *)((long)puVar21 + 4);
            puVar20 = (ulong *)((long)puVar20 + 4);
          }
          if ((puVar21 < (ulong *)((long)puVar27 - 1U)) && ((short)*puVar20 == (short)*puVar21)) {
            puVar21 = (ulong *)((long)puVar21 + 2);
            puVar20 = (ulong *)((long)puVar20 + 2);
          }
          if (puVar21 < puVar27) {
            puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar20 == (char)*puVar21));
          }
          uVar24 = (ulong)(uint)((int)puVar21 - (int)puVar33);
        }
        goto LAB_001111a0;
      }
      if (*puVar20 == *puVar33) {
        puVar20 = (ulong *)(piVar9 + 3);
        puVar21 = (ulong *)((long)puVar32 + 0xc);
        goto LAB_00111130;
      }
      uVar23 = *puVar33 ^ *puVar20;
      uVar24 = 0;
      if (uVar23 != 0) {
        for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
        }
      }
      uVar24 = uVar24 >> 3 & 0x1fffffff;
LAB_001111a0:
      uVar18 = (uint)uVar24;
      puVar33 = (ulong *)((long)puVar32 + uVar24 + 4);
      if (puVar33 == puVar27) {
        puVar33 = puVar27;
        puVar20 = (ulong *)source;
        if (puVar10 <= puVar27) {
LAB_001111d3:
          puVar32 = (ulong *)((long)puVar32 + (long)piVar2 + (uVar25 - (long)piVar9));
          if (puVar7 <= puVar32) {
            puVar32 = puVar7;
          }
          iVar28 = (int)puVar33 - (int)puVar32;
LAB_001111ec:
          if (puVar33 < puVar10) {
            if (*puVar20 == *puVar33) goto code_r0x00111201;
            uVar23 = *puVar33 ^ *puVar20;
            uVar24 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
              }
            }
            uVar12 = ((uint)(uVar24 >> 3) & 0x1fffffff) + iVar28;
          }
          else {
            if ((puVar33 < source + (long)srcSize + -8) && ((int)*puVar20 == (int)*puVar33)) {
              puVar33 = (ulong *)((long)puVar33 + 4);
              puVar20 = (ulong *)((long)puVar20 + 4);
            }
            if ((puVar33 < source + (long)srcSize + -6) && ((short)*puVar20 == (short)*puVar33)) {
              puVar33 = (ulong *)((long)puVar33 + 2);
              puVar20 = (ulong *)((long)puVar20 + 2);
            }
            if (puVar33 < puVar7) {
              puVar33 = (ulong *)((long)puVar33 + (ulong)((char)*puVar20 == (char)*puVar33));
            }
            uVar12 = (int)puVar33 - (int)puVar27;
          }
          goto LAB_00111226;
        }
        if (*(ulong *)source == *puVar27) {
          puVar33 = puVar27 + 1;
          puVar20 = (ulong *)(source + 8);
          goto LAB_001111d3;
        }
        uVar23 = *puVar27 ^ *(ulong *)source;
        uVar24 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
          }
        }
        uVar12 = (uint)(uVar24 >> 3) & 0x1fffffff;
LAB_00111226:
        uVar18 = uVar18 + uVar12;
        puVar33 = (ulong *)((long)puVar27 + (ulong)uVar12);
      }
    }
    else {
      puVar33 = (ulong *)((long)puVar32 + 4);
      puVar27 = (ulong *)(piVar9 + 1);
      puVar20 = puVar33;
      if (puVar10 <= puVar33) {
LAB_001110c3:
        iVar28 = ((int)puVar20 - (int)puVar32) + -4;
LAB_001110cb:
        if (puVar20 < puVar10) {
          if (*puVar27 == *puVar20) goto code_r0x001110e3;
          uVar23 = *puVar20 ^ *puVar27;
          uVar24 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
            }
          }
          uVar24 = (ulong)(((uint)(uVar24 >> 3) & 0x1fffffff) + iVar28);
        }
        else {
          if ((puVar20 < source + (long)srcSize + -8) && ((int)*puVar27 == (int)*puVar20)) {
            puVar20 = (ulong *)((long)puVar20 + 4);
            puVar27 = (ulong *)((long)puVar27 + 4);
          }
          if ((puVar20 < source + (long)srcSize + -6) && ((short)*puVar27 == (short)*puVar20)) {
            puVar20 = (ulong *)((long)puVar20 + 2);
            puVar27 = (ulong *)((long)puVar27 + 2);
          }
          if (puVar20 < puVar7) {
            puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar27 == (char)*puVar20));
          }
          uVar24 = (ulong)(uint)((int)puVar20 - (int)puVar33);
        }
        goto LAB_00111179;
      }
      if (*puVar27 == *puVar33) {
        puVar27 = (ulong *)(piVar9 + 3);
        puVar20 = (ulong *)((long)puVar32 + 0xc);
        goto LAB_001110c3;
      }
      uVar23 = *puVar33 ^ *puVar27;
      uVar24 = 0;
      if (uVar23 != 0) {
        for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
        }
      }
      uVar24 = uVar24 >> 3 & 0x1fffffff;
LAB_00111179:
      uVar18 = (uint)uVar24;
      puVar33 = (ulong *)((long)puVar32 + uVar24 + 4);
    }
    dest = (char *)((long)puVar31 + 2);
    if (uVar18 < 0xf) {
      *local_a8 = *local_a8 + (char)uVar18;
    }
    else {
      *local_a8 = *local_a8 + '\x0f';
      dest[0] = -1;
      dest[1] = -1;
      dest[2] = -1;
      dest[3] = -1;
      lVar26 = 0;
      for (uVar12 = uVar18 - 0xf; 0x3fb < uVar12; uVar12 = uVar12 - 0x3fc) {
        pcVar16 = (char *)((long)puVar31 + lVar26 + 6);
        pcVar16[0] = -1;
        pcVar16[1] = -1;
        pcVar16[2] = -1;
        pcVar16[3] = -1;
        lVar26 = lVar26 + 4;
      }
      lVar3 = lVar26 + (ulong)(uVar12 & 0xffff) / 0xff;
      dest = (char *)((long)puVar31 + lVar3 + 3);
      *(char *)((long)puVar31 + lVar3 + 2) =
           (char)((ushort)uVar12 / 0xff) + (char)uVar18 + -0xf + (char)lVar26;
    }
    if (source + (long)srcSize + -0xb <= puVar33) goto LAB_00111a16;
    *(int *)((long)LZ4_dict +
            ((ulong)(*(long *)((long)puVar33 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
         ((int)puVar33 + -2) - iVar29;
    uVar24 = *puVar33 * -0x30e4432345000000 >> 0x34;
    uVar12 = (int)puVar33 - iVar29;
    uVar18 = *(uint *)((long)LZ4_dict + uVar24 * 4);
    piVar14 = (int *)source;
    lVar26 = lVar30;
    if (uVar18 < uVar1) {
      piVar14 = piVar2;
      lVar26 = lVar6;
    }
    piVar9 = (int *)(lVar26 + (ulong)uVar18);
    *(uint *)((long)LZ4_dict + uVar24 * 4) = uVar12;
    local_a8 = dest;
    if (((uVar18 < uVar1 - uVar19) || (uVar18 + 0xffff < uVar12)) || (*piVar9 != (int)*puVar33))
    goto LAB_00110f58;
    puVar31 = (ulong *)(dest + 1);
    *dest = '\0';
    iVar13 = uVar12 - uVar18;
    puVar32 = puVar33;
  } while( true );
  puVar21 = puVar21 + 1;
  puVar20 = puVar20 + 1;
  iVar28 = iVar28 + 8;
  goto LAB_0011113a;
code_r0x00111201:
  puVar33 = puVar33 + 1;
  puVar20 = puVar20 + 1;
  iVar28 = iVar28 + 8;
  goto LAB_001111ec;
code_r0x001110e3:
  puVar20 = puVar20 + 1;
  puVar27 = puVar27 + 1;
  iVar28 = iVar28 + 8;
  goto LAB_001110cb;
}

Assistant:

int LZ4_compress_forceExtDict (LZ4_stream_t* LZ4_dict, const char* source, char* dest, int srcSize)
{
    LZ4_stream_t_internal* streamPtr = &LZ4_dict->internal_donotuse;
    int result;

    LZ4_renormDictT(streamPtr, srcSize);

    if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset)) {
        result = LZ4_compress_generic(streamPtr, source, dest, srcSize, NULL, 0, notLimited, byU32, usingExtDict, dictSmall, 1);
    } else {
        result = LZ4_compress_generic(streamPtr, source, dest, srcSize, NULL, 0, notLimited, byU32, usingExtDict, noDictIssue, 1);
    }

    streamPtr->dictionary = (const BYTE*)source;
    streamPtr->dictSize = (U32)srcSize;

    return result;
}